

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_count(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
               lys_module *UNUSED_local_mod,lyxp_set *set,int UNUSED_options)

{
  lyxp_set *set_00;
  char *pcVar1;
  longdouble number;
  
  set_00 = *args;
  if (set_00->type == LYXP_SET_NODE_SET) {
    number = (longdouble)set_00->used;
  }
  else {
    if (set_00->type != LYXP_SET_EMPTY) {
      pcVar1 = print_set_type(set_00);
      ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar1,"count(node-set)");
      return -1;
    }
    number = (longdouble)0;
  }
  set_fill_number(set,number);
  return 0;
}

Assistant:

static int
xpath_count(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
            struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int UNUSED(options))
{
    if (args[0]->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "count(node-set)");
        return -1;
    }

    set_fill_number(set, args[0]->used);
    return EXIT_SUCCESS;
}